

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O1

void boost::filesystem::detail::directory_iterator_construct
               (directory_iterator *it,path *p,error_code *ec)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *peVar2;
  pointer pcVar3;
  bool bVar4;
  DIR *pDVar5;
  void *pvVar6;
  int *piVar7;
  path *ppVar8;
  int error_num;
  err_t error_num_00;
  string_type filename;
  undefined1 local_b8 [40];
  char *local_90;
  long local_88;
  char local_80;
  undefined7 uStack_7f;
  path local_70;
  long *local_50 [2];
  long local_40 [2];
  
  error_num_00 = 0;
  if ((p->m_pathname)._M_string_length == 0) {
    error_num_00 = (anonymous_namespace)::not_found_error_code;
  }
  bVar4 = anon_unknown.dwarf_59c2::error
                    (error_num_00,p,ec,"boost::filesystem::directory_iterator::construct");
  if (!bVar4) {
    local_90 = &local_80;
    local_88 = 0;
    local_80 = '\0';
    peVar2 = (it->m_imp).px;
    if (peVar2 == (element_type *)0x0) {
LAB_0010de0a:
      __assert_fail("px != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Naios[P]boost-minimal-dist/boost/smart_ptr/shared_ptr.hpp"
                    ,0x2b5,
                    "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<boost::filesystem::detail::dir_itr_imp>::operator->() const [T = boost::filesystem::detail::dir_itr_imp]"
                   );
    }
    pDVar5 = opendir((p->m_pathname)._M_dataplus._M_p);
    peVar2->handle = pDVar5;
    if (pDVar5 == (DIR *)0x0) {
      piVar7 = __errno_location();
      error_num = *piVar7;
      system::system_category();
    }
    else {
      local_b8._16_2_ = 0x2e;
      local_b8._8_8_ = (sp_counted_base *)0x1;
      local_b8._0_8_ = local_b8 + 0x10;
      std::__cxx11::string::operator=((string *)&local_90,(string *)local_b8);
      if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
        operator_delete((void *)local_b8._0_8_,CONCAT62(local_b8._18_6_,local_b8._16_2_) + 1);
      }
      error_num = (anonymous_namespace)::ok;
      if ((anonymous_namespace)::ok == 0) {
        pvVar6 = malloc(0x1019);
        peVar2->buffer = pvVar6;
      }
    }
    if (error_num == 0) {
      peVar2 = (it->m_imp).px;
      if (peVar2 == (element_type *)0x0) goto LAB_0010de0a;
      if (peVar2->handle == (void *)0x0) {
        (it->m_imp).px = (element_type *)0x0;
        local_b8._8_8_ = (it->m_imp).pn.pi_;
        (it->m_imp).pn.pi_ = (sp_counted_base *)0x0;
        local_b8._0_8_ = peVar2;
        boost::detail::shared_count::~shared_count((shared_count *)(local_b8 + 8));
      }
      else {
        paVar1 = &local_70.m_pathname.field_2;
        local_70.m_pathname._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_90,local_90 + local_88);
        pcVar3 = (p->m_pathname)._M_dataplus._M_p;
        local_b8._0_8_ = (element_type *)(local_b8 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_b8,pcVar3,pcVar3 + (p->m_pathname)._M_string_length);
        ppVar8 = path::operator/=((path *)local_b8,&local_70);
        pcVar3 = (ppVar8->m_pathname)._M_dataplus._M_p;
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_50,pcVar3,pcVar3 + (ppVar8->m_pathname)._M_string_length);
        if ((element_type *)local_b8._0_8_ != (element_type *)(local_b8 + 0x10)) {
          operator_delete((void *)local_b8._0_8_,CONCAT62(local_b8._18_6_,local_b8._16_2_) + 1);
        }
        std::__cxx11::string::_M_assign((string *)peVar2);
        (peVar2->dir_entry).m_status.m_value = status_error;
        (peVar2->dir_entry).m_status.m_perms = perms_not_known;
        (peVar2->dir_entry).m_symlink_status.m_value = status_error;
        (peVar2->dir_entry).m_symlink_status.m_perms = perms_not_known;
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70.m_pathname._M_dataplus._M_p != paVar1) {
          operator_delete(local_70.m_pathname._M_dataplus._M_p,
                          local_70.m_pathname.field_2._M_allocated_capacity + 1);
        }
        if ((*local_90 == '.') && ((local_88 == 1 || ((local_88 == 2 && (local_90[1] == '.')))))) {
          directory_iterator_increment(it,ec);
        }
      }
    }
    else {
      local_b8._0_8_ = (it->m_imp).px;
      (it->m_imp).px = (element_type *)0x0;
      local_b8._8_8_ = (it->m_imp).pn.pi_;
      (it->m_imp).pn.pi_ = (sp_counted_base *)0x0;
      boost::detail::shared_count::~shared_count((shared_count *)(local_b8 + 8));
      anon_unknown.dwarf_59c2::error
                (error_num,p,ec,"boost::filesystem::directory_iterator::construct");
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
    }
  }
  return;
}

Assistant:

void directory_iterator_construct(directory_iterator& it,
    const path& p, system::error_code* ec)    
  {
    if (error(p.empty() ? not_found_error_code.value() : 0, p, ec,
              "boost::filesystem::directory_iterator::construct"))
      return;

    path::string_type filename;
    file_status file_stat, symlink_file_stat;
    error_code result = dir_itr_first(it.m_imp->handle,
#     if defined(BOOST_POSIX_API)
      it.m_imp->buffer,
#     endif
      p.c_str(), filename, file_stat, symlink_file_stat);

    if (result)
    {
      it.m_imp.reset();
      error(result.value(), p,
        ec, "boost::filesystem::directory_iterator::construct");
      return;
    }
    
    if (it.m_imp->handle == 0)
      it.m_imp.reset(); // eof, so make end iterator
    else // not eof
    {
      it.m_imp->dir_entry.assign(p / filename, file_stat, symlink_file_stat);
      if (filename[0] == dot // dot or dot-dot
        && (filename.size()== 1
          || (filename[1] == dot
            && filename.size()== 2)))
        {  it.increment(*ec); }
    }
  }